

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeglobals.cpp
# Opt level: O0

QString * __thiscall QMakeGlobals::shadowedPath(QMakeGlobals *this,QString *fileName)

{
  bool bVar1;
  uint uVar2;
  qsizetype qVar3;
  qsizetype qVar4;
  QString *a;
  QString *in_RDX;
  long in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<const_QString_&,_QString> *in_stack_ffffffffffffff58;
  QString *in_stack_ffffffffffffff60;
  QString *in_stack_ffffffffffffff68;
  QLatin1Char ch;
  bool local_7a;
  bool local_79;
  undefined1 local_48 [59];
  QLatin1Char local_d [3];
  char16_t local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QString::isEmpty((QString *)0x30c83e);
  if (bVar1) {
    QString::QString(in_stack_ffffffffffffff60,(QString *)in_stack_ffffffffffffff58);
  }
  else {
    uVar2 = QString::startsWith((QString *)in_RDX,(int)in_RSI + 0x178);
    local_79 = false;
    if ((uVar2 & 1) != 0) {
      qVar3 = QString::size(in_RDX);
      qVar4 = QString::size((QString *)(in_RSI + 0x178));
      local_7a = true;
      if (qVar3 != qVar4) {
        QString::size((QString *)(in_RSI + 0x178));
        local_a = (char16_t)
                  QString::at(in_stack_ffffffffffffff68,(qsizetype)in_stack_ffffffffffffff60);
        ch.ch = (char)((ulong)in_stack_ffffffffffffff68 >> 0x38);
        QLatin1Char::QLatin1Char(local_d,'/');
        QChar::QChar<QLatin1Char,_true>((QChar *)in_stack_ffffffffffffff60,ch);
        local_7a = ::operator==((QChar *)in_stack_ffffffffffffff60,
                                (QChar *)in_stack_ffffffffffffff58);
      }
      local_79 = local_7a;
    }
    if (local_79 == false) {
      QString::QString((QString *)0x30c9bf);
    }
    else {
      a = (QString *)(in_RSI + 400);
      QString::size((QString *)(in_RSI + 0x178));
      QString::mid((longlong)local_48,(longlong)in_RDX);
      ::operator+(a,in_RDX);
      ::QStringBuilder::operator_cast_to_QString(in_stack_ffffffffffffff58);
      QStringBuilder<const_QString_&,_QString>::~QStringBuilder
                ((QStringBuilder<const_QString_&,_QString> *)0x30c9a9);
      QString::~QString((QString *)0x30c9b3);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString QMakeGlobals::shadowedPath(const QString &fileName) const
{
    if (source_root.isEmpty())
        return fileName;
    if (fileName.startsWith(source_root)
        && (fileName.size() == source_root.size()
            || fileName.at(source_root.size()) == QLatin1Char('/'))) {
        return build_root + fileName.mid(source_root.size());
    }
    return QString();
}